

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test2.cpp
# Opt level: O2

int main(void)

{
  result_type_conflict *prVar1;
  uint uVar2;
  result_type_conflict rVar3;
  ulong uVar4;
  pointer puVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  result_type __x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sparse;
  uint32_t row;
  vector<unsigned_long,_std::allocator<unsigned_long>_> result;
  uniform_int_distribution<unsigned_int> dis_row;
  mt19937_64 gen;
  random_device rd;
  allocator_type local_1df9;
  undefined1 local_1df8 [16];
  pointer local_1de8;
  value_type_conflict2 local_1de0;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1dd8;
  ulong local_1dc0;
  ulong local_1db8;
  param_type local_1db0;
  normal_distribution<double> local_1da8;
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  local_1d80;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  uVar2 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&local_1d80,(ulong)uVar2);
  local_1db0._M_a = 0;
  local_1db0._M_b = 0xfff;
  local_1da8._M_param._M_mean = 40.96;
  local_1da8._M_param._M_stddev = 8.192;
  local_1da8._M_saved = 0.0;
  local_1da8._M_saved_available = false;
  local_1df8 = ZEXT816(0) << 0x20;
  local_1de8 = (pointer)0x0;
  local_1dd8._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  do {
    if (0x103f < (uint)local_1dd8._M_impl.super__Vector_impl_data._M_start) {
      local_1de0 = 0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_1dd8,0x1040,
                 &local_1de0,&local_1df9);
      blanczos(local_1df8._0_8_,(ulong)((long)(local_1df8._8_8_ - local_1df8._0_8_) >> 2) >> 1,
               0x1000,0x1040,
               CONCAT44(local_1dd8._M_impl.super__Vector_impl_data._M_start._4_4_,
                        (uint)local_1dd8._M_impl.super__Vector_impl_data._M_start));
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1dd8);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_1df8);
      std::random_device::~random_device(&local_13b8);
      return 0;
    }
    __x = std::normal_distribution<double>::operator()(&local_1da8,&local_1d80);
    local_1dc0 = lrint(__x);
    uVar8 = (long)(local_1df8._8_8_ - local_1df8._0_8_) >> 2;
    local_1dc0 = local_1dc0 & 0xffffffff;
    uVar4 = 0;
    puVar5 = (pointer)local_1df8._0_8_;
    puVar6 = (pointer)local_1df8._8_8_;
    while (uVar4 != local_1dc0) {
      local_1db8 = uVar4;
LAB_001033c7:
      if ((long)puVar6 - (long)puVar5 >> 2 == (uint)((int)uVar4 * 2) + uVar8) {
        rVar3 = std::uniform_int_distribution<unsigned_int>::operator()
                          ((uniform_int_distribution<unsigned_int> *)&local_1db0,&local_1d80);
        local_1de0 = CONCAT44(local_1de0._4_4_,rVar3);
        uVar7 = uVar8;
        do {
          if ((ulong)((long)(local_1df8._8_8_ - local_1df8._0_8_) >> 2) <= uVar7) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1df8,
                       (value_type_conflict *)&local_1de0);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1df8,
                       (value_type_conflict *)&local_1dd8);
            puVar5 = (pointer)local_1df8._0_8_;
            puVar6 = (pointer)local_1df8._8_8_;
            break;
          }
          prVar1 = (result_type_conflict *)(local_1df8._0_8_ + uVar7 * 4);
          puVar5 = (pointer)local_1df8._0_8_;
          puVar6 = (pointer)local_1df8._8_8_;
          uVar7 = uVar7 + 2;
        } while (*prVar1 != rVar3);
        goto LAB_001033c7;
      }
      uVar4 = local_1db8 + 1;
    }
    local_1dd8._M_impl.super__Vector_impl_data._M_start._0_4_ =
         (uint)local_1dd8._M_impl.super__Vector_impl_data._M_start + 1;
  } while( true );
}

Assistant:

int main()
{
    constexpr double   dens  = 0.01;
    constexpr uint32_t Nrow  = 1U << 12U;
    constexpr uint32_t Ncol  = Nrow + 64U;

    std::random_device rd;
    std::mt19937_64 gen(rd());
    std::uniform_int_distribution<uint32_t> dis_row(0U, Nrow - 1U);
    std::normal_distribution<double> dis_normal(dens * Nrow, 0.2 * dens * Nrow);

    std::vector<uint32_t> sparse;
    for (uint32_t col = 0U; col < Ncol; ++col)
    {
        const uint32_t Nsamples = lrint(dis_normal(gen));
        const uint64_t Nbefore  = sparse.size();
        for (uint32_t elem = 0U; elem < Nsamples; ++elem)
        {
            while (sparse.size() == Nbefore + 2U * elem)
            {
                const uint32_t row = dis_row(gen);
                bool exists = false;
                for (uint64_t old = Nbefore; old < sparse.size(); old += 2U)
                    if (sparse[old] == row)
                    {
                        exists = true;
                        break;
                    }
                if (!exists)
                {
                    sparse.push_back(row);
                    sparse.push_back(col);
                }
            }
        }
    }

    std::vector<uint64_t> result = std::vector<uint64_t>(Ncol, 0U);
    /*uint32_t Nsol =*/ blanczos(&sparse[0U], sparse.size() >> 1U, Nrow, Ncol, &result[0U]);
    
    return 0;
}